

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

float_specs fmt::v11::detail::parse_float_type_spec(format_specs *specs)

{
  byte bVar1;
  uint uVar2;
  format_specs *specs_local;
  float_specs result;
  
  bVar1 = specs->field_0xa;
  uVar2 = (*(ushort *)&specs->field_0x9 & 0x200) << 7;
  specs_local = (format_specs *)((ulong)((bVar1 & 1) << 0x12 | uVar2) << 0x20);
  switch(specs->type) {
  default:
    break;
  case debug:
    specs_local = (format_specs *)
                  ((ulong)(uVar2 | 1 | (uint)((bVar1 & 1) != 0 || specs->precision != 0) << 0x12) <<
                  0x20);
    break;
  case fixed:
    specs_local = (format_specs *)
                  ((ulong)(uVar2 | 2 | (uint)((bVar1 & 1) != 0 || specs->precision != 0) << 0x12) <<
                  0x20);
    break;
  case dec:
  }
  return (float_specs)specs_local;
}

Assistant:

FMT_CONSTEXPR inline auto parse_float_type_spec(const format_specs& specs)
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  default:
    FMT_FALLTHROUGH;
  case presentation_type::none:
    result.format = float_format::general;
    break;
  case presentation_type::exp:
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::fixed:
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::general:
    result.format = float_format::general;
    break;
  }
  return result;
}